

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

void __thiscall
ImGuiStb::stb_textedit_find_charpos
          (ImGuiStb *this,StbFindState *find,ImGuiTextEditState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  int line_start_idx;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  ImVec2 IVar7;
  ImWchar *local_38;
  
  iVar2 = (int)str;
  iVar3 = find[2].first_char;
  if (iVar3 == iVar2) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar4 = 0;
      iVar3 = 0;
      if (iVar2 < 1) {
        iVar5 = 0;
      }
      else {
        do {
          iVar5 = iVar3;
          local_38 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)&find->length + (long)iVar5 * 2);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)&find->length + (long)find[2].first_char * 2),
                     &local_38,(ImVec2 *)0x1,SUB41(single_line,0));
          iVar4 = iVar5 + (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
          iVar3 = iVar4;
        } while (iVar4 < iVar2);
      }
      *(int *)(this + 0xc) = iVar4;
      *(undefined4 *)(this + 0x10) = 0;
      *(int *)(this + 0x14) = iVar5;
    }
    else {
      IVar7 = InputTextCalcTextSizeW
                        (*(ImWchar **)&find->length,*(ImWchar **)&find->length + iVar2,&local_38,
                         (ImVec2 *)0x1,SUB41(single_line,0));
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(int *)(this + 0x10) = iVar2;
      *(float *)(this + 8) = IVar7.y;
      *(float *)this = IVar7.x;
    }
  }
  else {
    fVar6 = 0.0;
    iVar4 = 0;
    iVar5 = 0;
    while( true ) {
      line_start_idx = iVar4;
      *(float *)(this + 4) = fVar6;
      local_38 = (ImWchar *)0x0;
      pIVar1 = (ImWchar *)(*(long *)&find->length + (long)line_start_idx * 2);
      IVar7 = InputTextCalcTextSizeW
                        (pIVar1,(ImWchar *)(*(long *)&find->length + (long)iVar3 * 2),&local_38,
                         (ImVec2 *)0x1,SUB41(single_line,0));
      iVar3 = (int)((ulong)((long)local_38 - (long)pIVar1) >> 1);
      iVar4 = line_start_idx + iVar3;
      if (iVar2 < iVar4) break;
      fVar6 = IVar7.y + *(float *)(this + 4);
      iVar3 = find[2].first_char;
      iVar5 = line_start_idx;
    }
    *(int *)(this + 0xc) = line_start_idx;
    *(int *)(this + 0x10) = iVar3;
    *(float *)(this + 8) = IVar7.y;
    *(int *)(this + 0x14) = iVar5;
    *(undefined4 *)this = 0;
    if (line_start_idx < iVar2) {
      iVar3 = 0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH((ImGuiTextEditState *)find,line_start_idx,iVar3);
        *(float *)this = fVar6 + *(float *)this;
        iVar3 = iVar3 + 1;
      } while (iVar2 - line_start_idx != iVar3);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   i = 0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}